

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_yoda_tests.cpp
# Opt level: O3

void __thiscall iu_NoYodaTest_x_iutest_x_StrEq_Test::Body(iu_NoYodaTest_x_iutest_x_StrEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestPartResultReporterInterface *pTVar3;
  bool bVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  ScopedSPITestFlag guard;
  size_type __dnew;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  undefined4 in_stack_fffffffffffffd88;
  ScopedGuard in_stack_fffffffffffffd8c;
  ScopedGuard SVar7;
  AssertionHelper local_270;
  SPIFailureChecker local_240;
  AssertionResult local_208;
  AssertionResult local_1e0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_240.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_00138760;
  local_240.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag
            ((ScopedSPITestFlag *)&stack0xfffffffffffffd8c);
  iutest::internal::CmpHelperSTREQ<char_const*,char*>
            (&local_1e0,(internal *)0x12e18f,"gx","hoge",gx,
             (char *)&iutest_type_traits::enabler_t<void>::value,
             (type **)CONCAT44(in_stack_fffffffffffffd8c.m_test_flags,in_stack_fffffffffffffd88));
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd8b);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x4e;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_270.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar1 = &local_1e0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  SVar7.m_test_flags = in_stack_fffffffffffffd8c.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = in_stack_fffffffffffffd8c.m_test_flags;
  local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x10;
  local_1b8._0_8_ = local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_270);
  local_1a8[0]._M_allocated_capacity =
       local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6465746365707845;
  *(char *)(local_1b8._0_8_ + 8) = ':';
  *(char *)(local_1b8._0_8_ + 9) = ' ';
  *(char *)(local_1b8._0_8_ + 10) = '\"';
  *(char *)(local_1b8._0_8_ + 0xb) = 'h';
  *(char *)(local_1b8._0_8_ + 0xc) = 'o';
  *(char *)(local_1b8._0_8_ + 0xd) = 'g';
  *(char *)(local_1b8._0_8_ + 0xe) = 'e';
  *(char *)(local_1b8._0_8_ + 0xf) = '\"';
  local_1b8._8_8_ = local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_208,&local_240,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
  }
  local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_001387d0;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_001387f8;
  pVVar6 = iutest::TestEnv::get_vars();
  bVar4 = local_208.m_result;
  pVVar6->m_testpartresult_reporter = pTVar3;
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,local_208.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_270);
    local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x12c1b3;
    local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x20000004e;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_240,(Fixed *)local_1b8,false);
    if (local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_240.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_208.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    iutest::detail::NewTestPartResultCheckHelper::
    Collector<iutest::detail::NoTestPartResultReporter>::Collector
              (&local_240.super_Collector<iutest::detail::NoTestPartResultReporter>);
    local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.
    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (TestPartResultReporterInterface)&PTR__Collector_00138760;
    local_240.m_Type = kNonFatalFailure;
    iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag
              ((ScopedSPITestFlag *)&stack0xfffffffffffffd8c);
    iutest::internal::CmpHelperSTREQ<char_const*,char*>
              (&local_1e0,(internal *)0x12e18f,"gx","hoge",gx,
               (char *)&iutest_type_traits::enabler_t<void>::value,
               (type **)CONCAT44(SVar7.m_test_flags,in_stack_fffffffffffffd88));
    if (local_1e0.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,local_1e0.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffd8b);
      local_270.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/no_yoda_tests.cpp"
      ;
      local_270.m_part_result.super_iuCodeMessage.m_line = 0x4f;
      local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_270.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0.m_message._M_dataplus._M_p,
                      local_1e0.m_message.field_2._M_allocated_capacity + 1);
    }
    pTVar5 = iutest::TestFlag::GetInstance();
    pTVar5->m_test_flags = SVar7.m_test_flags;
    local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x10;
    local_1b8._0_8_ = local_1a8;
    local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_270);
    local_1a8[0]._M_allocated_capacity =
         local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    *(undefined8 *)local_1b8._0_8_ = 0x6465746365707845;
    *(char *)(local_1b8._0_8_ + 8) = ':';
    *(char *)(local_1b8._0_8_ + 9) = ' ';
    *(char *)(local_1b8._0_8_ + 10) = '\"';
    *(char *)(local_1b8._0_8_ + 0xb) = 'h';
    *(char *)(local_1b8._0_8_ + 0xc) = 'o';
    *(char *)(local_1b8._0_8_ + 0xd) = 'g';
    *(char *)(local_1b8._0_8_ + 0xe) = 'e';
    *(char *)(local_1b8._0_8_ + 0xf) = '\"';
    local_1b8._8_8_ = local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
    *(char *)(local_1b8._0_8_ +
             (long)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
    iutest::detail::SPIFailureChecker::GetResult(&local_208,&local_240,(string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != local_1a8) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
    }
    local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.
    super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
    _vptr_TestPartResultReporterInterface =
         (TestPartResultReporterInterface)&PTR__Collector_001387d0;
    std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
              (&local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
    pTVar3 = local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
    local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.
    _vptr_ReporterHolder = (_func_int **)&PTR__ReporterHolder_001387f8;
    pVVar6 = iutest::TestEnv::get_vars();
    pVVar6->m_testpartresult_reporter = pTVar3;
    if (local_208.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,local_208.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_270);
      local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x12c1b3;
      local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x20000004f;
      iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_240,(Fixed *)local_1b8,false);
      if (local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.
          super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
          _vptr_TestPartResultReporterInterface !=
          (TestPartResultReporterInterface)
          &local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
        operator_delete((void *)local_240.super_Collector<iutest::detail::NoTestPartResultReporter>.
                                super_NoTestPartResultReporter.super_TestPartResultReporterInterface
                                ._vptr_TestPartResultReporterInterface,
                        (ulong)((long)&(local_240.
                                        super_Collector<iutest::detail::NoTestPartResultReporter>.
                                        m_holder.m_origin)->_vptr_TestPartResultReporterInterface +
                               1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_message._M_dataplus._M_p,
                      local_208.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(NoYodaTest, StrEq)
{
    IUTEST_ASSERT_FATAL_FAILURE   ( IUTEST_ASSERT_STREQ(gx, "hoge"), "Expected: \"hoge\"" );
    IUTEST_ASSERT_NONFATAL_FAILURE( IUTEST_EXPECT_STREQ(gx, "hoge"), "Expected: \"hoge\"" );
}